

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

int Aig_TransferMappedClasses(Aig_Man_t *pAig,Aig_Man_t *pPart,int *pMapBack)

{
  void *pvVar1;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode2;
  int i;
  int iVar2;
  
  if (pPart->pReprs == (Aig_Obj_t **)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    for (i = 0; i < pPart->vObjs->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(pPart->vObjs,i);
      if ((pvVar1 != (void *)0x0) &&
         (pPart->pReprs[*(int *)((long)pvVar1 + 0x24)] != (Aig_Obj_t *)0x0)) {
        iVar2 = iVar2 + 1;
        pNode1 = Aig_ManObj(pAig,pMapBack[*(int *)((long)pvVar1 + 0x24)]);
        pNode2 = Aig_ManObj(pAig,pMapBack[pPart->pReprs[*(int *)((long)pvVar1 + 0x24)]->Id]);
        Aig_ObjSetRepr_(pAig,pNode1,pNode2);
      }
    }
  }
  return iVar2;
}

Assistant:

int Aig_TransferMappedClasses( Aig_Man_t * pAig, Aig_Man_t * pPart, int * pMapBack )
{
    Aig_Obj_t * pObj;
    int nClasses, k;
    nClasses = 0;
    if ( pPart->pReprs ) {
      Aig_ManForEachObj( pPart, pObj, k )
      {
          if ( pPart->pReprs[pObj->Id] == NULL )
              continue;
          nClasses++;
          Aig_ObjSetRepr_( pAig,
              Aig_ManObj(pAig, pMapBack[pObj->Id]),
              Aig_ManObj(pAig, pMapBack[pPart->pReprs[pObj->Id]->Id]) );
      }
    }
    return nClasses;
}